

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O3

void __thiscall
dg::vr::VRCodeGraph::VRCodeGraphIterator::VRCodeGraphIterator
          (VRCodeGraphIterator *this,MappingIterator end)

{
  _Rb_tree_header *p_Var1;
  
  (this->intoMapping)._M_node = end._M_node;
  (this->endMapping)._M_node = end._M_node;
  p_Var1 = &(this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header;
  (this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  *(_Base_ptr *)
   ((long)&(this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header
   + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x18) = p_Var1;
  (this->intoFunction).super_LazyVisit.visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->intoFunction).stack.
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intoFunction).stack.
  super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->intoFunction).stack.
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->intoFunction).stack.
           super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

VRCodeGraph::VRCodeGraphIterator::VRCodeGraphIterator(MappingIterator end)
        : intoMapping(end), endMapping(end) {}